

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O3

Position * __thiscall pfederc::Position::operator+(Position *this,Position *pos)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Position *in_RDI;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  uVar9 = pos->endIndex;
  if (pos->endIndex < this->endIndex) {
    uVar9 = this->endIndex;
  }
  uVar5 = (uint)pos->line;
  uVar6 = *(uint *)((long)&pos->line + 4);
  uVar7 = (uint)pos->startIndex;
  uVar8 = *(uint *)((long)&pos->startIndex + 4);
  uVar1 = (uint)this->line;
  uVar2 = *(uint *)((long)&this->line + 4);
  uVar3 = (uint)this->startIndex;
  uVar4 = *(uint *)((long)&this->startIndex + 4);
  uVar12 = uVar6 ^ 0x80000000;
  uVar13 = uVar8 ^ 0x80000000;
  uVar10 = uVar2 ^ 0x80000000;
  uVar11 = uVar4 ^ 0x80000000;
  uVar14 = -(uint)((int)(uVar5 ^ 0x80000000) < (int)(uVar1 ^ 0x80000000));
  uVar15 = -(uint)((int)uVar12 < (int)uVar10);
  uVar16 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar3 ^ 0x80000000));
  uVar17 = -(uint)((int)uVar13 < (int)uVar11);
  uVar10 = -(uint)(uVar10 == uVar12);
  uVar11 = -(uint)(uVar11 == uVar13);
  uVar12 = uVar15 | uVar10 & uVar14;
  uVar15 = uVar15 | uVar10 & uVar14;
  uVar10 = uVar17 | uVar11 & uVar16;
  uVar17 = uVar17 | uVar11 & uVar16;
  *(uint *)&in_RDI->line = ~uVar12 & uVar1 | uVar5 & uVar12;
  *(uint *)((long)&in_RDI->line + 4) = ~uVar15 & uVar2 | uVar6 & uVar15;
  *(uint *)&in_RDI->startIndex = ~uVar10 & uVar3 | uVar7 & uVar10;
  *(uint *)((long)&in_RDI->startIndex + 4) = ~uVar17 & uVar4 | uVar8 & uVar17;
  in_RDI->endIndex = uVar9;
  return in_RDI;
}

Assistant:

Position Position::operator +(const Position &pos) const noexcept {
  return Position{std::min(line, pos.line),
    std::min(startIndex, pos.startIndex),
    std::max(endIndex, pos.endIndex)};
}